

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testcopy.cpp
# Opt level: O2

void init_windows(void)

{
  Am_Drawonable *pAVar1;
  Am_Style local_40 [8];
  Am_Style local_38 [8];
  Am_Style local_30 [8];
  Am_Style local_28 [8];
  
  pAVar1 = (Am_Drawonable *)Am_Drawonable::Get_Root_Drawonable((char *)0x0);
  root = pAVar1;
  Am_Style::Am_Style(local_28,(Am_Style *)&Am_No_Style);
  d1 = (Am_Drawonable *)
       (*(code *)**(undefined8 **)pAVar1)
                 (pAVar1,0x352,0x1e,0x96,100,"D1","",1,0,local_28,0,1,1,0,0,1,0,0,1,0);
  Am_Style::~Am_Style(local_28);
  pAVar1 = root;
  Am_Style::Am_Style(local_30,(Am_Style *)&Am_No_Style);
  d2 = (Am_Drawonable *)
       (*(code *)**(undefined8 **)pAVar1)
                 (pAVar1,0x2ee,0xaa,0x96,100,"D2","",1,0,local_30,0,1,1,0,0,1,0,0,1,0);
  Am_Style::~Am_Style(local_30);
  pAVar1 = root;
  Am_Style::Am_Style(local_38,(Am_Style *)&Am_No_Style);
  d3 = (Am_Drawonable *)
       (*(code *)**(undefined8 **)pAVar1)
                 (pAVar1,0x28a,300,0x96,100,"D3","",1,0,local_38,0,1,1,0,0,1,0,0,1,0);
  Am_Style::~Am_Style(local_38);
  pAVar1 = root;
  Am_Style::Am_Style(local_40,(Am_Style *)&Am_No_Style);
  d4 = (Am_Drawonable *)
       (*(code *)**(undefined8 **)pAVar1)
                 (pAVar1,0x3b6,0xaa,0x96,100,"D4","",1,0,local_40,0,1,1,0,0,1,0,0,1,0);
  Am_Style::~Am_Style(local_40);
  return;
}

Assistant:

void
init_windows()
{
  root = Am_Drawonable::Get_Root_Drawonable();
  d1 = root->Create(850, 30, 150, 100, "D1");
  d2 = root->Create(750, 170, 150, 100, "D2");
  d3 = root->Create(650, 300, 150, 100, "D3");
  d4 = root->Create(950, 170, 150, 100, "D4");
}